

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_parse_rfc5280_time_internal(CBS *cbs,int is_gentime,int allow_timezone_offset,tm *out_tm)

{
  int iVar1;
  size_t sVar2;
  int local_6c;
  int local_68;
  int offset_minutes;
  int offset_hours;
  int offset_seconds;
  int offset_sign;
  uint8_t tz;
  CBS copy;
  int local_40;
  int tmp;
  int sec;
  int min;
  int hour;
  int day;
  int month;
  int year;
  tm *out_tm_local;
  int allow_timezone_offset_local;
  int is_gentime_local;
  CBS *cbs_local;
  
  _offset_sign = cbs->data;
  copy.data = (uint8_t *)cbs->len;
  _month = out_tm;
  out_tm_local._0_4_ = allow_timezone_offset;
  out_tm_local._4_4_ = is_gentime;
  _allow_timezone_offset_local = cbs;
  if (is_gentime == 0) {
    day = 0x76c;
    iVar1 = cbs_get_two_digits((CBS *)&offset_sign,(int *)((long)&copy.len + 4));
    if (iVar1 == 0) {
      return 0;
    }
    day = copy.len._4_4_ + day;
    if (day < 0x79e) {
      day = day + 100;
    }
    if (0x801 < day) {
      return 0;
    }
  }
  else {
    iVar1 = cbs_get_two_digits((CBS *)&offset_sign,(int *)((long)&copy.len + 4));
    if (iVar1 == 0) {
      return 0;
    }
    day = copy.len._4_4_ * 100;
    iVar1 = cbs_get_two_digits((CBS *)&offset_sign,(int *)((long)&copy.len + 4));
    if (iVar1 == 0) {
      return 0;
    }
    day = copy.len._4_4_ + day;
  }
  iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&hour);
  if (((((((iVar1 == 0) || (hour < 1)) || (0xc < hour)) ||
        ((iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&min), iVar1 == 0 ||
         (iVar1 = is_valid_day(day,hour,min), iVar1 == 0)))) ||
       ((iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&sec), iVar1 == 0 ||
        ((0x17 < sec || (iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&tmp), iVar1 == 0)))))) ||
      (0x3b < tmp)) ||
     (((iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&local_40), iVar1 == 0 || (0x3b < local_40))
      || (iVar1 = CBS_get_u8((CBS *)&offset_sign,(uint8_t *)((long)&offset_seconds + 3)), iVar1 == 0
         )))) {
    return 0;
  }
  offset_hours = 0;
  if (offset_seconds._3_1_ == '+') {
    offset_hours = 1;
  }
  else if (offset_seconds._3_1_ == '-') {
    offset_hours = -1;
  }
  else if (offset_seconds._3_1_ != 'Z') {
    return 0;
  }
  offset_minutes = 0;
  if (offset_hours != 0) {
    if ((int)out_tm_local == 0) {
      return 0;
    }
    iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&local_68);
    if (((iVar1 == 0) || (0x17 < local_68)) ||
       ((iVar1 = cbs_get_two_digits((CBS *)&offset_sign,&local_6c), iVar1 == 0 || (0x3b < local_6c))
       )) {
      return 0;
    }
    offset_minutes = offset_hours * (local_68 * 0xe10 + local_6c * 0x3c);
  }
  sVar2 = CBS_len((CBS *)&offset_sign);
  if (sVar2 == 0) {
    if (_month != (tm *)0x0) {
      _month->tm_year = day + -0x76c;
      _month->tm_mon = hour + -1;
      _month->tm_mday = min;
      _month->tm_hour = sec;
      _month->tm_min = tmp;
      _month->tm_sec = local_40;
      if ((offset_minutes != 0) &&
         (iVar1 = OPENSSL_gmtime_adj(_month,0,(long)offset_minutes), iVar1 == 0)) {
        return 0;
      }
    }
    cbs_local._4_4_ = 1;
  }
  else {
    cbs_local._4_4_ = 0;
  }
  return cbs_local._4_4_;
}

Assistant:

static int CBS_parse_rfc5280_time_internal(const CBS *cbs, int is_gentime,
                                           int allow_timezone_offset,
                                           struct tm *out_tm) {
  int year, month, day, hour, min, sec, tmp;
  CBS copy = *cbs;
  uint8_t tz;

  if (is_gentime) {
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year = tmp * 100;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
  } else {
    year = 1900;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
    if (year < 1950) {
      year += 100;
    }
    if (year >= 2050) {
      return 0;  // A Generalized time must be used.
    }
  }
  if (!cbs_get_two_digits(&copy, &month) || month < 1 ||
      month > 12 ||  // Reject invalid months.
      !cbs_get_two_digits(&copy, &day) ||
      !is_valid_day(year, month, day) ||  // Reject invalid days.
      !cbs_get_two_digits(&copy, &hour) ||
      hour > 23 ||  // Reject invalid hours.
      !cbs_get_two_digits(&copy, &min) ||
      min > 59 ||  // Reject invalid minutes.
      !cbs_get_two_digits(&copy, &sec) || sec > 59 || !CBS_get_u8(&copy, &tz)) {
    return 0;
  }

  int offset_sign = 0;
  switch (tz) {
    case 'Z':
      break;  // We correctly have 'Z' on the end as per spec.
    case '+':
      offset_sign = 1;
      break;  // Should not be allowed per RFC 5280.
    case '-':
      offset_sign = -1;
      break;  // Should not be allowed per RFC 5280.
    default:
      return 0;  // Reject anything else after the time.
  }

  // If allow_timezone_offset is non-zero, allow for a four digit timezone
  // offset to be specified even though this is not allowed by RFC 5280. We are
  // permissive of this for UTCTimes due to the unfortunate existence of
  // artisinally rolled long lived certificates that were baked into places that
  // are now difficult to change. These certificates were generated with the
  // 'openssl' command that permissively allowed the creation of certificates
  // with notBefore and notAfter times specified as strings for direct
  // certificate inclusion on the command line. For context see cl/237068815.
  //
  // TODO(bbe): This has been expunged from public web-pki as the ecosystem has
  // managed to encourage CA compliance with standards. We should find a way to
  // get rid of this or make it off by default.
  int offset_seconds = 0;
  if (offset_sign != 0) {
    if (!allow_timezone_offset) {
      return 0;
    }
    int offset_hours, offset_minutes;
    if (!cbs_get_two_digits(&copy, &offset_hours) ||
        offset_hours > 23 ||  // Reject invalid hours.
        !cbs_get_two_digits(&copy, &offset_minutes) ||
        offset_minutes > 59) {  // Reject invalid minutes.
      return 0;
    }
    offset_seconds = offset_sign * (offset_hours * 3600 + offset_minutes * 60);
  }

  if (CBS_len(&copy) != 0) {
    return 0;  // Reject invalid lengths.
  }

  if (out_tm != NULL) {
    // Fill in the tm fields corresponding to what we validated.
    out_tm->tm_year = year - 1900;
    out_tm->tm_mon = month - 1;
    out_tm->tm_mday = day;
    out_tm->tm_hour = hour;
    out_tm->tm_min = min;
    out_tm->tm_sec = sec;
    if (offset_seconds && !OPENSSL_gmtime_adj(out_tm, 0, offset_seconds)) {
      return 0;
    }
  }
  return 1;
}